

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_payload_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PayloadList *payload,uint32_t indent)

{
  bool bVar1;
  type *ptVar2;
  type *__x;
  ostream *poVar3;
  size_type sVar4;
  reference v;
  uint32_t n;
  ListEditQual v_00;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  type vars;
  stringstream local_1a8 [4];
  type listEditQual;
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
  *ppStack_18;
  uint32_t indent_local;
  PayloadList *payload_local;
  
  local_1c = (uint)payload;
  ppStack_18 = (pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
                *)this;
  payload_local = (PayloadList *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  ptVar2 = std::
           get<0ul,tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>
                     (ppStack_18);
  vars.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *ptVar2;
  __x = std::
        get<1ul,tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>
                  (ppStack_18);
  std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
            ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_1c8,__x);
  pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)(ulong)local_1c,n);
  std::operator<<(aoStack_198,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  if (vars.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != ResetToExplicit) {
    to_string_abi_cxx11_
              (&local_208,
               (tinyusdz *)
               (ulong)vars.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,v_00);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_208);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_208);
  }
  std::operator<<(aoStack_198,"payload = ");
  bVar1 = std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::empty
                    ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_1c8);
  if (bVar1) {
    std::operator<<(aoStack_198,"None");
  }
  else {
    sVar4 = std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::size
                      ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_1c8);
    if (sVar4 == 1) {
      v = std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator[]
                    ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_1c8,0);
      std::operator<<(aoStack_198,v);
    }
    else {
      std::operator<<(aoStack_198,
                      (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_1c8);
    }
  }
  std::operator<<(aoStack_198,"\n");
  std::__cxx11::stringstream::str();
  std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
            ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_payload(const prim::PayloadList &payload,
                          const uint32_t indent) {
  std::stringstream ss;

  auto listEditQual = std::get<0>(payload);
  auto vars = std::get<1>(payload);

  ss << pprint::Indent(indent);

  if (listEditQual != ListEditQual::ResetToExplicit) {
    ss << to_string(listEditQual) << " ";
  }

  ss << "payload = ";
  if (vars.empty()) {
    ss << "None";
  } else {
    if (vars.size() == 1) {
      ss << vars[0];
    } else {
      ss << vars;
    }
  }
  ss << "\n";

  return ss.str();
}